

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O1

word Ifd_ObjTruth_rec(Ifd_Man_t *p,int iLit,int *pCounter)

{
  int iVar1;
  uint uVar2;
  word wVar3;
  word wVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  Ifd_Obj_t *pIVar8;
  ulong uVar9;
  
  if (iLit < 0) goto LAB_0040b5c9;
  if ((iLit & 1U) != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0xe9,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
  }
  if (iLit == 2) {
    iVar1 = *pCounter;
    *pCounter = iVar1 + 1;
    return Ifd_ObjTruth_rec::s_Truths6[iVar1];
  }
  uVar7 = (uint)iLit >> 1;
  if (p->nObjs <= (int)uVar7) {
    __assert_fail("i >= 0 && i < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0x49,"Ifd_Obj_t *Ifd_ManObj(Ifd_Man_t *, int)");
  }
  uVar2 = p->pObjs[uVar7].pFans[0];
  if (-1 < (int)uVar2) {
    pIVar8 = p->pObjs + uVar7;
    wVar3 = Ifd_ObjTruth_rec(p,uVar2 & 0x7ffffffe,pCounter);
    if (-1 < (int)pIVar8->pFans[1]) {
      wVar4 = Ifd_ObjTruth_rec(p,pIVar8->pFans[1] & 0x7ffffffe,pCounter);
      uVar7 = pIVar8->pFans[2];
      if (uVar7 == 0xffffffff) {
        uVar5 = 0;
      }
      else {
        if ((int)uVar7 < 0) goto LAB_0040b5e8;
        uVar5 = Ifd_ObjTruth_rec(p,uVar7 & 0x7ffffffe,pCounter);
      }
      if ((-1 < (int)pIVar8->pFans[0]) && (-1 < (int)pIVar8->pFans[1])) {
        uVar7 = pIVar8->pFans[2];
        if (uVar7 != 0xffffffff) {
          if ((int)uVar7 < 0) goto LAB_0040b5c9;
          uVar5 = uVar5 ^ -(ulong)(uVar7 & 1);
        }
        uVar6 = wVar3 ^ -(ulong)(pIVar8->pFans[0] & 1);
        uVar9 = wVar4 ^ -(ulong)(pIVar8->pFans[1] & 1);
        switch(*(uint *)pIVar8 >> 0x1d & 3) {
        case 0:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                        ,0xfe,"word Ifd_ObjTruth_rec(Ifd_Man_t *, int, int *)");
        case 1:
          return uVar9 & uVar6;
        case 3:
          uVar9 = (uVar9 ^ uVar6) & uVar5;
        }
        return uVar9 ^ uVar6;
      }
LAB_0040b5c9:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf3,"int Abc_LitIsCompl(int)");
    }
  }
LAB_0040b5e8:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf6,"int Abc_LitRegular(int)");
}

Assistant:

word Ifd_ObjTruth_rec( Ifd_Man_t * p, int iLit, int * pCounter )
{
    static word s_Truths6[6] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000)
    };
    Ifd_Obj_t * pDsd;
    word Fun0, Fun1, Fun2 = 0;
    assert( !Abc_LitIsCompl(iLit) );
    if ( iLit == 2 )
        return s_Truths6[(*pCounter)++];
    pDsd = Ifd_ManObjFromLit( p, iLit );

    Fun0 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[0]), pCounter );
    Fun1 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[1]), pCounter );
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Ifd_ObjTruth_rec( p, Abc_LitRegular(pDsd->pFans[2]), pCounter );

    Fun0 = Abc_LitIsCompl(pDsd->pFans[0]) ? ~Fun0 : Fun0;
    Fun1 = Abc_LitIsCompl(pDsd->pFans[1]) ? ~Fun1 : Fun1;
    if ( pDsd->pFans[2] != -1 )
    Fun2 = Abc_LitIsCompl(pDsd->pFans[2]) ? ~Fun2 : Fun2;

    if ( pDsd->Type == 1 )
        return Fun0 & Fun1;
    if ( pDsd->Type == 2 )
        return Fun0 ^ Fun1;
    if ( pDsd->Type == 3 )
        return (Fun2 & Fun1) | (~Fun2 & Fun0);
    assert( 0 );
    return -1;
}